

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O1

feed_db_status_t import_feed_db(char *dir,feed_db_t *db)

{
  uint uVar1;
  feed_db_status_t fVar2;
  char *table;
  size_t i;
  ulong uVar3;
  long lVar4;
  char **filenames;
  char *full_file_name;
  char **local_40;
  char *local_38;
  
  uVar1 = list_txt_files(dir,&local_40);
  begin_transaction_db(db);
  if ((int)uVar1 < 1) {
LAB_00110eb9:
    end_transaction_db(db);
    fVar2 = FEED_DB_SUCCESS;
    if (local_40 != (char **)0x0) {
      if (0 < (int)uVar1) {
        lVar4 = 0;
        do {
          free(local_40[lVar4]);
          lVar4 = lVar4 + 1;
        } while ((int)uVar1 != lVar4);
      }
LAB_00110f13:
      free(local_40);
    }
    return fVar2;
  }
  uVar3 = 0;
LAB_00110e5d:
  make_filepath(&local_38,dir,local_40[uVar3]);
  table = get_filename_no_ext(local_40[uVar3],'/');
  fVar2 = import_csv_file_db(local_38,table,db);
  free(table);
  free(local_38);
  if (fVar2 != FEED_DB_ERROR) goto code_r0x00110eb1;
  fVar2 = FEED_DB_ERROR;
  if (local_40 == (char **)0x0) {
    return FEED_DB_ERROR;
  }
  uVar3 = 0;
  do {
    free(local_40[uVar3]);
    uVar3 = uVar3 + 1;
  } while (uVar1 != uVar3);
  goto LAB_00110f13;
code_r0x00110eb1:
  uVar3 = uVar3 + 1;
  if (uVar1 == uVar3) goto LAB_00110eb9;
  goto LAB_00110e5d;
}

Assistant:

feed_db_status_t import_feed_db(const char *dir, feed_db_t *db) {
    char **filenames;
    int filecount = 0;

    char *full_file_name;
    char *table_file_name;

    filecount = list_txt_files(dir, &filenames);

    begin_transaction_db(db);

    for (int i = 0; i < filecount; i++) {
        make_filepath(&full_file_name, dir, filenames[i]);
        table_file_name = get_filename_no_ext(filenames[i], *FILENAME_SEPARATOR);

        if (FEED_DB_SUCCESS != import_csv_file_db(full_file_name, table_file_name, db)) {
            free(table_file_name);
            free(full_file_name);
            free_cstr_arr(filenames, filecount);
            return FEED_DB_ERROR;
        }
        free(table_file_name);
        free(full_file_name);
    }

    end_transaction_db(db);

    free_cstr_arr(filenames, filecount);
    return FEED_DB_SUCCESS;
}